

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sxhash.c
# Opt level: O0

LispPTR STRING_EQUAL_HASHBITS(LispPTR object)

{
  unsigned_short uVar1;
  LispPTR object_local;
  
  uVar1 = stringequalhash(object);
  return uVar1 | 0xe0000;
}

Assistant:

LispPTR STRING_EQUAL_HASHBITS(LispPTR object) {
  return (S_POSITIVE | (0xFFFF & (stringequalhash(object))));
}